

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_join_leave.cxx
# Opt level: O0

void __thiscall
nuraft::raft_server::handle_join_leave_rpc_err(raft_server *this,msg_type t_msg,ptr<peer> *p)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  size_type sVar4;
  element_type *peVar5;
  int in_ESI;
  long in_RDI;
  int32 in_stack_000000bc;
  raft_server *in_stack_000000c0;
  peer_itor pit;
  undefined7 in_stack_fffffffffffffe98;
  undefined1 in_stack_fffffffffffffe9f;
  raft_server *in_stack_fffffffffffffea0;
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false>
  in_stack_fffffffffffffea8;
  string *format;
  raft_server *in_stack_fffffffffffffee0;
  ptr<peer> *in_stack_fffffffffffffee8;
  raft_server *in_stack_fffffffffffffef0;
  string local_f8 [32];
  string local_d8 [32];
  string local_b8 [32];
  string local_98 [32];
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false> local_78;
  __node_type *local_70;
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false> local_68;
  int32 local_5c;
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false> local_58;
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false> local_50 [3];
  
  if (in_ESI == 0xe) {
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
    if (bVar1) {
      peVar5 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x218ab9);
      iVar2 = (*peVar5->_vptr_logger[7])();
      if (3 < iVar2) {
        in_stack_fffffffffffffee8 =
             (ptr<peer> *)
             std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x218adc);
        std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x218aeb);
        uVar3 = peer::get_id((peer *)0x218af3);
        in_stack_fffffffffffffef0 = (raft_server *)&stack0xffffffffffffffc8;
        msg_if_given_abi_cxx11_
                  ((char *)in_stack_fffffffffffffef0,
                   "rpc failed for removing server (%d), will remove this server directly",
                   (ulong)uVar3);
        (**(code **)((long)&(((in_stack_fffffffffffffee8->
                              super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                            ->rpc_protector_).super___mutex_base._M_mutex + 0x10))
                  (in_stack_fffffffffffffee8,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
                   ,"handle_join_leave_rpc_err",0x21f,in_stack_fffffffffffffef0);
        std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
      }
    }
    sVar4 = std::
            unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
            ::size((unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
                    *)0x218b84);
    if (sVar4 == 1) {
      in_stack_fffffffffffffee0 = (raft_server *)(in_RDI + 0x1e0);
      std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x218ba8);
      local_5c = peer::get_id((peer *)0x218bb0);
      local_58._M_cur =
           (__node_type *)
           std::
           unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
           ::find((unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
                   *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98),
                  (key_type *)0x218bc9);
      std::__detail::
      _Node_const_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>::
      _Node_const_iterator
                ((_Node_const_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>
                  *)in_stack_fffffffffffffea0,
                 (_Node_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>
                  *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98));
      local_68._M_cur =
           (__node_type *)
           std::
           unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
           ::end((unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
                  *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98));
      bVar1 = std::__detail::operator!=(local_50,&local_68);
      if (bVar1) {
        std::__detail::
        _Node_const_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>::
        operator->((_Node_const_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>
                    *)0x218c2a);
        std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x218c36);
        peer::enable_hb((peer *)in_stack_fffffffffffffea0,(bool)in_stack_fffffffffffffe9f);
        local_70 = local_50[0]._M_cur;
        local_78._M_cur =
             (__node_type *)
             std::
             unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
             ::erase((unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
                      *)in_stack_fffffffffffffea0,in_stack_fffffffffffffea8._M_cur);
        bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
        if (bVar1) {
          peVar5 = std::
                   __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x218c9c);
          iVar2 = (*peVar5->_vptr_logger[7])();
          if (3 < iVar2) {
            peVar5 = std::
                     __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x218cbf);
            std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x218cce);
            uVar3 = peer::get_id((peer *)0x218cd6);
            msg_if_given_abi_cxx11_
                      ((char *)local_98,"server %d is removed from cluster",(ulong)uVar3);
            (*peVar5->_vptr_logger[8])
                      (peVar5,4,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
                       ,"handle_join_leave_rpc_err",0x234,local_98);
            std::__cxx11::string::~string(local_98);
          }
        }
      }
      else {
        bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
        if (bVar1) {
          peVar5 = std::
                   __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x218d86);
          iVar2 = (*peVar5->_vptr_logger[7])();
          if (3 < iVar2) {
            peVar5 = std::
                     __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x218da9);
            std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x218db8);
            uVar3 = peer::get_id((peer *)0x218dc0);
            msg_if_given_abi_cxx11_
                      ((char *)local_b8,"peer %d cannot be found, no action for removing",
                       (ulong)uVar3);
            (*peVar5->_vptr_logger[8])
                      (peVar5,4,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
                       ,"handle_join_leave_rpc_err",0x237,local_b8);
            std::__cxx11::string::~string(local_b8);
          }
        }
      }
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x3b8));
      if (bVar1) {
        reset_srv_to_leave(in_stack_fffffffffffffee0);
      }
    }
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x3b8));
    if (bVar1) {
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
      if (bVar1) {
        peVar5 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x218eaa);
        iVar2 = (*peVar5->_vptr_logger[7])();
        if (2 < iVar2) {
          peVar5 = std::
                   __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x218ecd);
          std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                     0x218ee3);
          uVar3 = peer::get_id((peer *)0x218eeb);
          msg_if_given_abi_cxx11_
                    ((char *)local_d8,
                     "srv_to_leave_ is already set to %d, will remove it from peer list",
                     (ulong)uVar3);
          (*peVar5->_vptr_logger[8])
                    (peVar5,3,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
                     ,"handle_join_leave_rpc_err",0x247,local_d8);
          std::__cxx11::string::~string(local_d8);
        }
      }
      remove_peer_from_peers(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
      reset_srv_to_leave(in_stack_fffffffffffffee0);
    }
    else {
      std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x218f95);
      peer::get_id((peer *)0x218f9d);
      rm_srv_from_cluster(in_stack_000000c0,in_stack_000000bc);
    }
  }
  else {
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
    if (bVar1) {
      peVar5 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x218fd9);
      iVar2 = (*peVar5->_vptr_logger[7])();
      if (3 < iVar2) {
        in_stack_fffffffffffffea0 =
             (raft_server *)
             std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x218ffc);
        std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x21900b);
        uVar3 = peer::get_id((peer *)0x219013);
        format = local_f8;
        msg_if_given_abi_cxx11_
                  ((char *)format,
                   "rpc failed again for the new coming server (%d), will stop retry for this server"
                   ,(ulong)uVar3);
        (*in_stack_fffffffffffffea0->_vptr_raft_server[8])
                  (in_stack_fffffffffffffea0,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
                   ,"handle_join_leave_rpc_err",0x253,format);
        std::__cxx11::string::~string(local_f8);
      }
    }
    *(undefined1 *)(in_RDI + 0xe9) = 0;
    reset_srv_to_join(in_stack_fffffffffffffea0);
  }
  return;
}

Assistant:

void raft_server::handle_join_leave_rpc_err(msg_type t_msg, ptr<peer> p) {
    if (t_msg == msg_type::leave_cluster_request) {
        p_in( "rpc failed for removing server (%d), "
              "will remove this server directly",
              p->get_id() );

        /**
         * In case of there are only two servers in the cluster,
         * it will be safe to remove the server directly from peers
         * as at most one config change could happen at a time
         *   prove:
         *     assume there could be two config changes at a time
         *     this means there must be a leader after previous leader
         *     offline, which is impossible (no leader could be elected
         *     after one server goes offline in case of only two servers
         *     in a cluster)
         * so the bug
         *   https://groups.google.com/forum/#!topic/raft-dev/t4xj6dJTP6E
         * does not apply to cluster which only has two members
         */
        if (peers_.size() == 1) {
            peer_itor pit = peers_.find(p->get_id());
            if (pit != peers_.end()) {
                pit->second->enable_hb(false);
                peers_.erase(pit);
                p_in("server %d is removed from cluster", p->get_id());
            } else {
                p_in("peer %d cannot be found, no action for removing",
                     p->get_id());
            }

            if (srv_to_leave_) {
                reset_srv_to_leave();
            }
        }

        if (srv_to_leave_) {
            // WARNING:
            //   If `srv_to_leave_` is already set, this function is probably
            //   invoked by `handle_hb_timeout`. In such a case, the server
            //   to be removed does not respond while the leader already
            //   generated the log for the configuration change. We should
            //   abandon the peer entry from `peers_`.
            p_wn("srv_to_leave_ is already set to %d, will remove it from "
                 "peer list", srv_to_leave_->get_id());
            remove_peer_from_peers(srv_to_leave_);
            reset_srv_to_leave();

        } else {
            // Set `srv_to_leave_` and generate a log for configuration change.
            rm_srv_from_cluster(p->get_id());
        }

    } else {
        p_in( "rpc failed again for the new coming server (%d), "
              "will stop retry for this server",
              p->get_id() );
        config_changing_ = false;
        reset_srv_to_join();
    }
}